

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void convert_buffer(DString *buffer,short format,_Bool array_out)

{
  DString *ripString;
  
  if (buffer != (DString *)0x0) {
    ripString = d_string_new("");
    if (format == 1) {
      ripString = tsv_to_json(buffer,array_out);
    }
    else if (format == 0) {
      ripString = csv_to_json(buffer,array_out);
    }
    if (ripString != (DString *)0x0) {
      fwrite(ripString->str,ripString->currentStringLength,1,_stdout);
    }
    d_string_free(ripString,true);
    return;
  }
  return;
}

Assistant:

void convert_buffer(DString * buffer, short format, bool array_out) {
	if (buffer) {
		DString * out = d_string_new("");

		switch (format) {
			case FORMAT_CSV:
				out = csv_to_json(buffer, array_out);
				break;

			case FORMAT_TSV:
				out = tsv_to_json(buffer, array_out);
				break;
		}

		if (out) {
			fwrite(out->str, out->currentStringLength, 1, stdout);
		}

		d_string_free(out, true);
	}
}